

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool duckdb_re2::re2_internal::Parse<float>(char *str,size_t n,float *dest)

{
  char *__nptr;
  int *piVar1;
  float fVar2;
  size_t n_local;
  char *end;
  char buf [201];
  
  if (n != 0) {
    n_local = n;
    __nptr = TerminateNumber(buf,0xc9,str,&n_local,true);
    piVar1 = __errno_location();
    *piVar1 = 0;
    fVar2 = strtof(__nptr,&end);
    if ((end == __nptr + n_local) && (*piVar1 == 0)) {
      if (dest == (float *)0x0) {
        return true;
      }
      *dest = fVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool Parse(const char* str, size_t n, float* dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, true);
  char* end;
  errno = 0;
  float r = strtof(str, &end);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *dest = r;
  return true;
}